

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear_glfw_gl2.h
# Opt level: O3

void nk_glfw3_render(nk_anti_aliasing AA)

{
  void *pvVar1;
  uint uVar2;
  nk_size nVar3;
  void *pvVar4;
  nk_size nVar5;
  ulong uVar6;
  nk_convert_config config;
  nk_buffer local_168;
  nk_buffer local_e8;
  nk_convert_config local_70;
  
  (*glad_glPushAttrib)(0x7000);
  (*glad_glDisable)(0xb44);
  (*glad_glDisable)(0xb71);
  (*glad_glEnable)(0xc11);
  (*glad_glEnable)(0xbe2);
  (*glad_glEnable)(0xde1);
  (*glad_glBlendFunc)(0x302,0x303);
  (*glad_glViewport)(0,0,glfw.display_width,glfw.display_height);
  (*glad_glMatrixMode)(0x1701);
  (*glad_glPushMatrix)();
  (*glad_glLoadIdentity)();
  (*glad_glOrtho)(0.0,(double)glfw.width,(double)glfw.height,0.0,-1.0,1.0);
  (*glad_glMatrixMode)(0x1700);
  (*glad_glPushMatrix)();
  (*glad_glLoadIdentity)();
  (*glad_glEnableClientState)(0x8074);
  (*glad_glEnableClientState)(0x8078);
  (*glad_glEnableClientState)(0x8076);
  local_70.vertex_layout = nk_glfw3_render::vertex_layout;
  local_70.vertex_size = 0x14;
  local_70.vertex_alignment = 4;
  local_70.null = glfw.ogl.null;
  local_70.circle_segment_count = 0x16;
  local_70.arc_segment_count = 0x16;
  local_70.curve_segment_count = 0x16;
  local_70.global_alpha = 1.0;
  local_e8.pool.free = (nk_plugin_free)0x0;
  local_e8.marker[0].active = 0;
  local_e8.marker[0]._4_4_ = 0;
  local_e8.marker[0].offset = 0;
  local_e8.marker[1].active = 0;
  local_e8.marker[1]._4_4_ = 0;
  local_e8.marker[1].offset = 0;
  local_e8.pool.userdata.ptr = (void *)0x0;
  local_e8.pool.alloc = (nk_plugin_alloc)0x0;
  local_e8.memory.ptr = (void *)0x0;
  local_e8.memory.size = 0;
  local_e8.grow_factor = 0.0;
  local_e8._84_4_ = 0;
  local_e8.allocated = 0;
  local_e8.needed = 0;
  local_e8.calls = 0;
  local_e8.type = NK_BUFFER_DYNAMIC;
  local_e8._60_4_ = 0;
  local_70.line_AA = AA;
  local_70.shape_AA = AA;
  local_e8.memory.ptr = malloc(0x1000);
  local_e8.memory.size = 0x1000;
  local_e8.size = 0x1000;
  local_e8.grow_factor = 2.0;
  local_e8.pool.userdata.ptr = (void *)0x0;
  local_e8.pool.alloc = nk_malloc;
  local_e8.pool.free = nk_mfree;
  local_168.pool.free = (nk_plugin_free)0x0;
  local_168.marker[0].active = 0;
  local_168.marker[0]._4_4_ = 0;
  local_168.marker[0].offset = 0;
  local_168.marker[1].active = 0;
  local_168.marker[1]._4_4_ = 0;
  local_168.marker[1].offset = 0;
  local_168.pool.userdata.ptr = (void *)0x0;
  local_168.pool.alloc = (nk_plugin_alloc)0x0;
  local_168.memory.ptr = (void *)0x0;
  local_168.memory.size = 0;
  local_168.grow_factor = 0.0;
  local_168._84_4_ = 0;
  local_168.allocated = 0;
  local_168.needed = 0;
  local_168.calls = 0;
  local_168.type = NK_BUFFER_DYNAMIC;
  local_168._60_4_ = 0;
  local_168.memory.ptr = malloc(0x1000);
  local_168.memory.size = 0x1000;
  local_168.size = 0x1000;
  local_168.grow_factor = 2.0;
  local_168.pool.userdata.ptr = (void *)0x0;
  local_168.pool.alloc = nk_malloc;
  local_168.pool.free = nk_mfree;
  nk_convert(&glfw.ctx,&glfw.ogl.cmds,&local_e8,&local_168,&local_70);
  pvVar4 = local_e8.memory.ptr;
  (*glad_glVertexPointer)(2,0x1406,0x14,local_e8.memory.ptr);
  (*glad_glTexCoordPointer)(2,0x1406,0x14,(void *)((long)pvVar4 + 8));
  (*glad_glColorPointer)(4,0x1401,0x14,(void *)((long)pvVar4 + 0x10));
  if ((glfw.ogl.cmds.memory.ptr != (void *)0x0 && glfw.ctx.draw_list.cmd_count != 0) &&
      glfw.ogl.cmds.size != 0) {
    uVar6 = (long)glfw.ogl.cmds.memory.ptr +
            (glfw.ogl.cmds.memory.size - glfw.ctx.draw_list.cmd_offset) + 0x20;
    pvVar1 = glfw.ogl.cmds.memory.ptr;
    nVar3 = glfw.ogl.cmds.memory.size;
    pvVar4 = local_168.memory.ptr;
    nVar5 = glfw.ctx.draw_list.cmd_offset;
    uVar2 = glfw.ctx.draw_list.cmd_count;
    do {
      if (*(int *)(uVar6 - 0x20) != 0) {
        (*glad_glBindTexture)(0xde1,*(GLuint *)(uVar6 - 8));
        (*glad_glScissor)((int)(*(float *)(uVar6 - 0x1c) * glfw.fb_scale.x),
                          (int)((float)(glfw.height -
                                       (int)(*(float *)(uVar6 - 0x18) + *(float *)(uVar6 - 0x10))) *
                               glfw.fb_scale.y),(int)(glfw.fb_scale.x * *(float *)(uVar6 - 0x14)),
                          (int)(*(float *)(uVar6 - 0x10) * glfw.fb_scale.y));
        (*glad_glDrawElements)(4,*(GLsizei *)(uVar6 - 0x20),0x1403,pvVar4);
        pvVar4 = (void *)((long)pvVar4 + (ulong)*(uint *)(uVar6 - 0x20) * 2);
        pvVar1 = glfw.ogl.cmds.memory.ptr;
        nVar3 = glfw.ogl.cmds.memory.size;
        nVar5 = glfw.ctx.draw_list.cmd_offset;
        uVar2 = glfw.ctx.draw_list.cmd_count;
      }
      uVar6 = uVar6 - 0x20;
    } while ((long)pvVar1 + (ulong)(uVar2 - 1) * -0x20 + (nVar3 - nVar5) < uVar6);
  }
  nk_clear(&glfw.ctx);
  if (((local_e8.memory.ptr != (void *)0x0) && (local_e8.type != NK_BUFFER_FIXED)) &&
     (local_e8.pool.free != (nk_plugin_free)0x0)) {
    (*local_e8.pool.free)(local_e8.pool.userdata,local_e8.memory.ptr);
  }
  if (((local_168.memory.ptr != (void *)0x0) && (local_168.type != NK_BUFFER_FIXED)) &&
     (local_168.pool.free != (nk_plugin_free)0x0)) {
    (*local_168.pool.free)(local_168.pool.userdata,local_168.memory.ptr);
  }
  (*glad_glDisableClientState)(0x8074);
  (*glad_glDisableClientState)(0x8078);
  (*glad_glDisableClientState)(0x8076);
  (*glad_glDisable)(0xb44);
  (*glad_glDisable)(0xb71);
  (*glad_glDisable)(0xc11);
  (*glad_glDisable)(0xbe2);
  (*glad_glDisable)(0xde1);
  (*glad_glBindTexture)(0xde1,0);
  (*glad_glMatrixMode)(0x1700);
  (*glad_glPopMatrix)();
  (*glad_glMatrixMode)(0x1701);
  (*glad_glPopMatrix)();
  (*glad_glPopAttrib)();
  return;
}

Assistant:

NK_API void
nk_glfw3_render(enum nk_anti_aliasing AA)
{
    /* setup global state */
    struct nk_glfw_device *dev = &glfw.ogl;
    glPushAttrib(GL_ENABLE_BIT|GL_COLOR_BUFFER_BIT|GL_TRANSFORM_BIT);
    glDisable(GL_CULL_FACE);
    glDisable(GL_DEPTH_TEST);
    glEnable(GL_SCISSOR_TEST);
    glEnable(GL_BLEND);
    glEnable(GL_TEXTURE_2D);
    glBlendFunc(GL_SRC_ALPHA, GL_ONE_MINUS_SRC_ALPHA);

    /* setup viewport/project */
    glViewport(0,0,(GLsizei)glfw.display_width,(GLsizei)glfw.display_height);
    glMatrixMode(GL_PROJECTION);
    glPushMatrix();
    glLoadIdentity();
    glOrtho(0.0f, glfw.width, glfw.height, 0.0f, -1.0f, 1.0f);
    glMatrixMode(GL_MODELVIEW);
    glPushMatrix();
    glLoadIdentity();

    glEnableClientState(GL_VERTEX_ARRAY);
    glEnableClientState(GL_TEXTURE_COORD_ARRAY);
    glEnableClientState(GL_COLOR_ARRAY);
    {
        GLsizei vs = sizeof(struct nk_glfw_vertex);
        size_t vp = offsetof(struct nk_glfw_vertex, position);
        size_t vt = offsetof(struct nk_glfw_vertex, uv);
        size_t vc = offsetof(struct nk_glfw_vertex, col);

        /* convert from command queue into draw list and draw to screen */
        const struct nk_draw_command *cmd;
        const nk_draw_index *offset = NULL;
        struct nk_buffer vbuf, ebuf;

        /* fill convert configuration */
        struct nk_convert_config config;
        static const struct nk_draw_vertex_layout_element vertex_layout[] = {
            {NK_VERTEX_POSITION, NK_FORMAT_FLOAT, NK_OFFSETOF(struct nk_glfw_vertex, position)},
            {NK_VERTEX_TEXCOORD, NK_FORMAT_FLOAT, NK_OFFSETOF(struct nk_glfw_vertex, uv)},
            {NK_VERTEX_COLOR, NK_FORMAT_R8G8B8A8, NK_OFFSETOF(struct nk_glfw_vertex, col)},
            {NK_VERTEX_LAYOUT_END}
        };
        NK_MEMSET(&config, 0, sizeof(config));
        config.vertex_layout = vertex_layout;
        config.vertex_size = sizeof(struct nk_glfw_vertex);
        config.vertex_alignment = NK_ALIGNOF(struct nk_glfw_vertex);
        config.null = dev->null;
        config.circle_segment_count = 22;
        config.curve_segment_count = 22;
        config.arc_segment_count = 22;
        config.global_alpha = 1.0f;
        config.shape_AA = AA;
        config.line_AA = AA;

        /* convert shapes into vertexes */
        nk_buffer_init_default(&vbuf);
        nk_buffer_init_default(&ebuf);
        nk_convert(&glfw.ctx, &dev->cmds, &vbuf, &ebuf, &config);

        /* setup vertex buffer pointer */
        {const void *vertices = nk_buffer_memory_const(&vbuf);
        glVertexPointer(2, GL_FLOAT, vs, (const void*)((const nk_byte*)vertices + vp));
        glTexCoordPointer(2, GL_FLOAT, vs, (const void*)((const nk_byte*)vertices + vt));
        glColorPointer(4, GL_UNSIGNED_BYTE, vs, (const void*)((const nk_byte*)vertices + vc));}

        /* iterate over and execute each draw command */
        offset = (const nk_draw_index*)nk_buffer_memory_const(&ebuf);
        nk_draw_foreach(cmd, &glfw.ctx, &dev->cmds)
        {
            if (!cmd->elem_count) continue;
            glBindTexture(GL_TEXTURE_2D, (GLuint)cmd->texture.id);
            glScissor(
                (GLint)(cmd->clip_rect.x * glfw.fb_scale.x),
                (GLint)((glfw.height - (GLint)(cmd->clip_rect.y + cmd->clip_rect.h)) * glfw.fb_scale.y),
                (GLint)(cmd->clip_rect.w * glfw.fb_scale.x),
                (GLint)(cmd->clip_rect.h * glfw.fb_scale.y));
            glDrawElements(GL_TRIANGLES, (GLsizei)cmd->elem_count, GL_UNSIGNED_SHORT, offset);
            offset += cmd->elem_count;
        }
        nk_clear(&glfw.ctx);
        nk_buffer_free(&vbuf);
        nk_buffer_free(&ebuf);
    }

    /* default OpenGL state */
    glDisableClientState(GL_VERTEX_ARRAY);
    glDisableClientState(GL_TEXTURE_COORD_ARRAY);
    glDisableClientState(GL_COLOR_ARRAY);

    glDisable(GL_CULL_FACE);
    glDisable(GL_DEPTH_TEST);
    glDisable(GL_SCISSOR_TEST);
    glDisable(GL_BLEND);
    glDisable(GL_TEXTURE_2D);

    glBindTexture(GL_TEXTURE_2D, 0);
    glMatrixMode(GL_MODELVIEW);
    glPopMatrix();
    glMatrixMode(GL_PROJECTION);
    glPopMatrix();
    glPopAttrib();
}